

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O3

uint Extra_TruthCanonN(uint uTruth,int nVars)

{
  uint uVar1;
  uint uVar2;
  int Polarity;
  
  uVar2 = 0xffffffff;
  if (nVars != 0x1f) {
    Polarity = 0;
    do {
      uVar1 = Extra_TruthPolarize(uTruth,Polarity,nVars);
      if (uVar1 <= uVar2) {
        uVar2 = uVar1;
      }
      Polarity = Polarity + 1;
    } while (1 << ((byte)nVars & 0x1f) != Polarity);
  }
  return uVar2;
}

Assistant:

unsigned Extra_TruthCanonN( unsigned uTruth, int nVars )
{
    unsigned uTruthMin, uPhase;
    int nMints, i;
    nMints    = (1 << nVars);
    uTruthMin = 0xFFFFFFFF;
    for ( i = 0; i < nMints; i++ )
    {
        uPhase = Extra_TruthPolarize( uTruth, i, nVars ); 
        if ( uTruthMin > uPhase )
            uTruthMin = uPhase;
    }
    return uTruthMin;
}